

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O3

bool bssl::tls1_parse_peer_sigalgs(SSL_HANDSHAKE *hs,CBS *in_sigalgs)

{
  bool bVar1;
  uint16_t uVar2;
  
  uVar2 = ssl_protocol_version(hs->ssl);
  bVar1 = true;
  if (0x302 < uVar2) {
    if (in_sigalgs->len != 0) {
      bVar1 = parse_u16_array(in_sigalgs,&hs->peer_sigalgs);
      return bVar1;
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool tls1_parse_peer_sigalgs(SSL_HANDSHAKE *hs, const CBS *in_sigalgs) {
  // Extension ignored for inappropriate versions
  if (ssl_protocol_version(hs->ssl) < TLS1_2_VERSION) {
    return true;
  }

  // In all contexts, the signature algorithms list may not be empty. (It may be
  // omitted by clients in TLS 1.2, but then the entire extension is omitted.)
  return CBS_len(in_sigalgs) != 0 &&
         parse_u16_array(in_sigalgs, &hs->peer_sigalgs);
}